

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::XmlReporter::benchmarkStarting(XmlReporter *this,BenchmarkInfo *info)

{
  StringRef name;
  StringRef name_00;
  StringRef name_01;
  StringRef name_02;
  StringRef name_03;
  char *rawChars;
  XmlWriter *pXVar1;
  XmlWriter *pXVar2;
  XmlWriter *pXVar3;
  size_type in_RSI;
  long in_RDI;
  StringRef SVar4;
  size_t in_stack_ffffffffffffff58;
  XmlFormatting fmt;
  undefined8 local_30;
  double *attribute;
  XmlWriter *this_00;
  char *pcVar5;
  
  rawChars = (char *)(in_RDI + 0x98);
  SVar4 = operator____sr(rawChars,in_stack_ffffffffffffff58);
  this_00 = (XmlWriter *)SVar4.m_start;
  pcVar5 = (char *)SVar4.m_size;
  name.m_size = in_RSI;
  name.m_start = pcVar5;
  pXVar1 = XmlWriter::writeAttribute<unsigned_int,void>(this_00,name,local_30);
  fmt = (XmlFormatting)((ulong)pXVar1 >> 0x20);
  SVar4 = operator____sr(rawChars,in_stack_ffffffffffffff58);
  name_00.m_size = in_RSI;
  name_00.m_start = pcVar5;
  attribute = (double *)SVar4.m_size;
  pXVar1 = XmlWriter::writeAttribute<unsigned_int,void>(this_00,name_00,(uint *)attribute);
  operator____sr(rawChars,in_stack_ffffffffffffff58);
  name_01.m_size = in_RSI;
  name_01.m_start = pcVar5;
  pXVar2 = XmlWriter::writeAttribute<int,void>(this_00,name_01,(int *)attribute);
  operator____sr(rawChars,in_stack_ffffffffffffff58);
  name_02.m_size = in_RSI;
  name_02.m_start = pcVar5;
  pXVar3 = XmlWriter::writeAttribute<double,void>(this_00,name_02,attribute);
  operator____sr(rawChars,in_stack_ffffffffffffff58);
  name_03.m_size = in_RSI;
  name_03.m_start = pcVar5;
  XmlWriter::writeAttribute<double,void>(this_00,name_03,attribute);
  operator____sr(rawChars,in_stack_ffffffffffffff58);
  operator|(Newline,Indent);
  SVar4.m_size = (size_type)pXVar3;
  SVar4.m_start = &pXVar2->m_tagIsOpen;
  XmlWriter::writeComment(pXVar1,SVar4,fmt);
  return;
}

Assistant:

void XmlReporter::benchmarkStarting(BenchmarkInfo const &info) {
        m_xml.writeAttribute("samples"_sr, info.samples)
            .writeAttribute("resamples"_sr, info.resamples)
            .writeAttribute("iterations"_sr, info.iterations)
            .writeAttribute("clockResolution"_sr, info.clockResolution)
            .writeAttribute("estimatedDuration"_sr, info.estimatedDuration)
            .writeComment("All values in nano seconds"_sr);
    }